

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_draw.cpp
# Opt level: O1

void Am_Draw_Check_Button_Box
               (am_rect r,Am_Drawonable *draw,Am_Widget_Look look,bool selected,
               bool interim_selected,Computed_Colors_Record *color_rec,bool mask)

{
  am_rect r_00;
  am_rect r_01;
  Am_Style *prev;
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  am_rect r_local;
  Am_Style upper_left;
  Am_Style lower_right;
  Am_Style fill_style;
  Am_Style line_style;
  Am_Style local_78;
  Am_Style local_70;
  Am_Style local_68;
  Am_Style local_60;
  float local_54;
  float local_50;
  float local_4c;
  Am_Image_Array local_48;
  Am_Image_Array local_40;
  Am_Image_Array local_38;
  
  r_local.left = r.left;
  r_local.top = r.top;
  r_local.width = r.width;
  r_local.height = r.height;
  (*draw->_vptr_Am_Drawonable[0x21])(draw,r._0_8_,(ulong)(uint)r_local.top);
  if (look.value == Am_MACINTOSH_LOOK_val) {
    Am_Image_Array::Am_Image_Array(&local_40,&Am_No_Image);
    Am_Style::Am_Style(&upper_left,"black",interim_selected + 1,Am_CAP_BUTT,Am_JOIN_MITER,
                       Am_LINE_SOLID,"\x04\x04",2,Am_FILL_SOLID,Am_FILL_POLY_EVEN_ODD,
                       (Am_Image_Array_Data *)&local_40);
    Am_Image_Array::~Am_Image_Array(&local_40);
    Am_Style::Am_Style(&lower_right,&Am_White);
    uVar1 = 7;
    if (!mask) {
      uVar1 = 0;
    }
    (*draw->_vptr_Am_Drawonable[0x2c])
              (draw,&upper_left,&lower_right,(ulong)(uint)r_local.left,(ulong)(uint)r_local.top,
               (ulong)(uint)r_local.width,(ulong)(uint)r_local.height,uVar1);
    if (selected) {
      Am_Image_Array::Am_Image_Array(&local_48,&Am_No_Image);
      Am_Style::Am_Style(&fill_style,"black",1,Am_CAP_BUTT,Am_JOIN_MITER,Am_LINE_SOLID,"\x04\x04",2,
                         Am_FILL_SOLID,Am_FILL_POLY_EVEN_ODD,(Am_Image_Array_Data *)&local_48);
      Am_Style::operator=(&upper_left,&fill_style);
      Am_Style::~Am_Style(&fill_style);
      Am_Image_Array::~Am_Image_Array(&local_48);
      (*draw->_vptr_Am_Drawonable[0x28])
                (draw,&upper_left,(ulong)(uint)r_local.left,(ulong)(uint)r_local.top,
                 (ulong)(uint)(r_local.width + r_local.left),
                 (ulong)(uint)(r_local.height + r_local.top),uVar1);
      (*draw->_vptr_Am_Drawonable[0x28])
                (draw,&upper_left,(ulong)(uint)r_local.left,
                 (ulong)((r_local.top + r_local.height) - 1),
                 (ulong)(uint)(r_local.left + -1 + r_local.width),(ulong)(uint)r_local.top,uVar1);
    }
  }
  else {
    if (look.value != Am_WINDOWS_LOOK_val) {
      if (look.value != Am_MOTIF_LOOK_val) {
        Am_Error("Unknown Look parameter");
      }
      if (mask) {
        (*draw->_vptr_Am_Drawonable[0x2c])
                  (draw,&Am_No_Style,&Am_On_Bits,(ulong)(uint)r_local.left,(ulong)(uint)r_local.top,
                   (ulong)(uint)r_local.width,(ulong)(uint)r_local.height,0);
      }
      else {
        Am_Draw_Motif_Box(r_local.left,r_local.top,r_local.width,r_local.height,
                          selected || interim_selected,color_rec,draw);
      }
      goto LAB_00230ed9;
    }
    Am_Style::Am_Style(&upper_left);
    Am_Style::Am_Style(&lower_right);
    Am_Style::operator=(&upper_left,&color_rec->data->background_style);
    Am_Style::operator=(&lower_right,&color_rec->data->highlight_style);
    if (mask) {
      (*draw->_vptr_Am_Drawonable[0x2c])
                (draw,&Am_On_Bits,&Am_No_Style,(ulong)(uint)r_local.left,(ulong)(uint)r_local.top,
                 (ulong)(uint)r_local.width,(ulong)(uint)r_local.height,0);
    }
    else {
      r_00.top = r_local.top;
      r_00.left = r_local.left;
      r_00.width = r_local.width;
      r_00.height = r_local.height;
      Am_Style::Am_Style(&local_60,&upper_left);
      Am_Style::Am_Style(&local_68,&lower_right);
      Am_Draw_Rect_Border(r_00,&local_60,&local_68,draw);
      Am_Style::~Am_Style(&local_68);
      Am_Style::~Am_Style(&local_60);
    }
    Inset_Rect(&r_local,1);
    Am_Style::operator=(&upper_left,&color_rec->data->shadow_style);
    Am_Style::operator=(&lower_right,&color_rec->data->foreground_style);
    if (mask) {
      (*draw->_vptr_Am_Drawonable[0x2c])
                (draw,&Am_On_Bits,&Am_No_Style,(ulong)(uint)r_local.left,(ulong)(uint)r_local.top,
                 (ulong)(uint)r_local.width,(ulong)(uint)r_local.height,0);
    }
    else {
      r_01.top = r_local.top;
      r_01.left = r_local.left;
      r_01.width = r_local.width;
      r_01.height = r_local.height;
      Am_Style::Am_Style(&local_70,&upper_left);
      Am_Style::Am_Style(&local_78,&lower_right);
      Am_Draw_Rect_Border(r_01,&local_70,&local_78,draw);
      Am_Style::~Am_Style(&local_78);
      Am_Style::~Am_Style(&local_70);
    }
    Inset_Rect(&r_local,1);
    if (interim_selected) {
      prev = &color_rec->data->foreground_style;
    }
    else {
      prev = &Am_White;
    }
    Am_Style::Am_Style(&fill_style,prev);
    uVar1 = 7;
    if (!mask) {
      uVar1 = 0;
    }
    (*draw->_vptr_Am_Drawonable[0x2c])
              (draw,&Am_No_Style,&fill_style,(ulong)(uint)r_local.left,(ulong)(uint)r_local.top,
               (ulong)(uint)r_local.width,(ulong)(uint)r_local.height,uVar1);
    if (selected) {
      Am_Image_Array::Am_Image_Array(&local_38,&Am_No_Image);
      Am_Style::Am_Style(&line_style,"black",1,Am_CAP_BUTT,Am_JOIN_MITER,Am_LINE_SOLID,"\x04\x04",2,
                         Am_FILL_SOLID,Am_FILL_POLY_EVEN_ODD,(Am_Image_Array_Data *)&local_38);
      Am_Image_Array::~Am_Image_Array(&local_38);
      fVar2 = (float)r_local.width * 0.11111111;
      fVar5 = fVar2 * 4.0 + (float)r_local.top + -1.0;
      local_50 = fVar2 * 6.0 + (float)r_local.top + -1.0;
      if (fVar5 <= local_50) {
        fVar3 = (float)r_local.left;
        local_54 = fVar2 + fVar2;
        fVar4 = fVar3 + local_54;
        do {
          local_4c = fVar5;
          (*draw->_vptr_Am_Drawonable[0x2a])
                    (draw,&line_style,&Am_No_Style,(ulong)(uint)(int)(fVar4 + -1.0 + 0.5),
                     (ulong)(uint)(int)(fVar5 + 0.5),
                     (ulong)(uint)(int)(fVar2 * 4.0 + fVar3 + -1.0 + 0.5),
                     (ulong)(uint)(int)(local_54 + fVar5 + 0.5),
                     (ulong)(uint)(int)(fVar2 * 8.0 + fVar3 + -1.0 + 0.5),
                     (ulong)(uint)(int)((fVar5 - local_54) + 0.5),uVar1);
          fVar5 = local_4c + 1.0;
        } while (fVar5 <= local_50);
      }
      Am_Style::~Am_Style(&line_style);
    }
    Am_Style::~Am_Style(&fill_style);
  }
  Am_Style::~Am_Style(&lower_right);
  Am_Style::~Am_Style(&upper_left);
LAB_00230ed9:
  (*draw->_vptr_Am_Drawonable[0x22])(draw);
  return;
}

Assistant:

void
Am_Draw_Check_Button_Box(am_rect r, // coords in terms of draw
                         Am_Drawonable *draw, Am_Widget_Look look,
                         bool selected, bool interim_selected,
                         const Computed_Colors_Record &color_rec,
                         bool mask = false)
{
  bool depressed = selected || interim_selected;
  draw->Push_Clip(r.left, r.top, r.width, r.height);

  switch (look.value) {
  case Am_MOTIF_LOOK_val: // just use the every useful Am_Draw_Motif_Bo_valx
    if (mask)
      draw->Draw_Rectangle(Am_No_Style, Am_On_Bits, r.left, r.top, r.width,
                           r.height);
    else
      Am_Draw_Motif_Box(r.left, r.top, r.width, r.height, depressed, color_rec,
                        draw);
    break;
  case Am_WINDOWS_LOOK_val: {
    // draw the outside rectangle
    Am_Style upper_left, lower_right;
    upper_left = color_rec.data->background_style;
    lower_right = color_rec.data->highlight_style;
    if (mask)
      draw->Draw_Rectangle(Am_On_Bits, Am_No_Style, r.left, r.top, r.width,
                           r.height);
    else
      Am_Draw_Rect_Border(r, upper_left, lower_right, draw);
    Inset_Rect(r, 1);

    // draw the inside rectangle
    upper_left = color_rec.data->shadow_style;
    lower_right = color_rec.data->foreground_style;
    if (mask)
      draw->Draw_Rectangle(Am_On_Bits, Am_No_Style, r.left, r.top, r.width,
                           r.height);
    else
      Am_Draw_Rect_Border(r, upper_left, lower_right, draw);
    Inset_Rect(r, 1);

    // draw the fill
    Am_Style fill_style =
        interim_selected ? color_rec.data->foreground_style : Am_White;
    draw->Draw_Rectangle(Am_No_Style, fill_style, r.left, r.top, r.width,
                         r.height, mask ? Am_DRAW_MASK_COPY : Am_DRAW_COPY);

    const float ninth = (float)1 / 9;
    if (selected) {
      Am_Style line_style("black", 1); // black and 1 pixel
      float pix = ninth * r.width, left_x = 2 * pix + r.left - 1 + 0.5f,
            center_x = 4 * pix + r.left - 1 + 0.5f,
            right_x = 8 * pix + r.left - 1 + 0.5f, min_y = 4 * pix + r.top - 1,
            max_y = 6 * pix + r.top - 1, twopix = 2 * pix;
      for (float y = min_y; y <= max_y; y += 1)
        draw->Draw_2_Lines(line_style, Am_No_Style, (int)left_x, (int)(y + 0.5),
                           (int)center_x, (int)(y + twopix + 0.5), (int)right_x,
                           (int)(y - twopix + 0.5),
                           mask ? Am_DRAW_MASK_COPY : Am_DRAW_COPY);
    }
    break;
  }

  case Am_MACINTOSH_LOOK_val: {
    Am_Style line_style("black", interim_selected ? 2 : 1);
    Am_Style fill_style = Am_White;
    draw->Draw_Rectangle(line_style, fill_style, r.left, r.top, r.width,
                         r.height, mask ? Am_DRAW_MASK_COPY : Am_DRAW_COPY);
    if (selected) { // draw the x mark
      line_style = Am_Style("black", 1);
      draw->Draw_Line(line_style, r.left, r.top, r.left + r.width,
                      r.top + r.height,
                      mask ? Am_DRAW_MASK_COPY : Am_DRAW_COPY);
      draw->Draw_Line(line_style, r.left, r.top + r.height - 1,
                      r.left + r.width - 1, r.top,
                      mask ? Am_DRAW_MASK_COPY : Am_DRAW_COPY);
    }
    break;
  }

  default:
    Am_Error("Unknown Look parameter");
    break;
  } // switch( look )

  draw->Pop_Clip();
}